

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Key.hpp
# Opt level: O0

Key<6UL> supermap::Key<6UL>::fromString(string *strKey)

{
  Key<6UL> KVar1;
  long lVar2;
  IllegalArgumentException *this;
  array<unsigned_char,_6UL> *paVar3;
  value_type_conflict2 *pvVar4;
  reference pvVar5;
  ulong in_RDI;
  size_t i;
  Key<6UL> arrKey;
  undefined7 in_stack_ffffffffffffff78;
  value_type_conflict2 vVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  uchar *this_00;
  uchar *local_68;
  unsigned_long in_stack_ffffffffffffffb8;
  string local_30 [32];
  ulong local_10;
  undefined4 local_6;
  undefined2 local_2;
  
  local_10 = in_RDI;
  lVar2 = std::__cxx11::string::length();
  if (lVar2 != 6) {
    this = (IllegalArgumentException *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string(in_stack_ffffffffffffffb8);
    std::operator+((char *)this,in_stack_ffffffffffffff80);
    supermap::IllegalArgumentException::IllegalArgumentException(this,local_30);
    __cxa_throw(this,&IllegalArgumentException::typeinfo,
                IllegalArgumentException::~IllegalArgumentException);
  }
  local_68 = (uchar *)0x0;
  while( true ) {
    this_00 = local_68;
    paVar3 = (array<unsigned_char,_6UL> *)std::__cxx11::string::length();
    if (paVar3 <= this_00) break;
    pvVar4 = (value_type_conflict2 *)std::__cxx11::string::operator[](local_10);
    vVar6 = *pvVar4;
    pvVar5 = std::array<unsigned_char,_6UL>::operator[]
                       ((array<unsigned_char,_6UL> *)this_00,
                        CONCAT17(vVar6,in_stack_ffffffffffffff78));
    *pvVar5 = vVar6;
    local_68 = local_68 + 1;
  }
  KVar1.super_array<unsigned_char,_6UL>._M_elems[4] = (undefined1)local_2;
  KVar1.super_array<unsigned_char,_6UL>._M_elems[5] = local_2._1_1_;
  KVar1.super_array<unsigned_char,_6UL>._M_elems[0] = (undefined1)local_6;
  KVar1.super_array<unsigned_char,_6UL>._M_elems[1] = local_6._1_1_;
  KVar1.super_array<unsigned_char,_6UL>._M_elems[2] = local_6._2_1_;
  KVar1.super_array<unsigned_char,_6UL>._M_elems[3] = local_6._3_1_;
  return (Key<6UL>)KVar1.super_array<unsigned_char,_6UL>._M_elems;
}

Assistant:

static Key<Len> fromString(const std::string &strKey) {
        if (strKey.length() != Len) {
            throw IllegalArgumentException(
                "String key length can not be different to template size parameter, expected: " + std::to_string(Len));
        }

        Key<Len> arrKey;
        for (std::size_t i = 0; i < strKey.length(); ++i) {
            arrKey[i] = strKey[i];
        }

        return arrKey;
    }